

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmrun.cpp
# Opt level: O1

uchar * __thiscall CVmRun::inh_prop(CVmRun *this,uint caller_ofs,vm_prop_id_t prop,uint argc)

{
  vm_obj_id_t vVar1;
  uint self;
  vm_datatype_t *pvVar2;
  vm_val_t *pvVar3;
  int found;
  uchar *puVar4;
  undefined6 in_register_00000012;
  vm_obj_id_t vVar5;
  uint argc_local;
  vm_obj_id_t srcobj;
  uint local_5c;
  CVmRun *local_58;
  vm_val_t val;
  vm_val_t orig_target_obj;
  
  vVar1 = frame_ptr_[-10].val.obj;
  vVar5 = 0;
  if (frame_ptr_[-9].typ == VM_OBJ) {
    vVar5 = frame_ptr_[-9].val.obj;
  }
  orig_target_obj.typ = VM_OBJ;
  self = frame_ptr_[-8].val.obj;
  argc_local = argc;
  local_5c = caller_ofs;
  local_58 = this;
  orig_target_obj.val.obj = vVar1;
  found = (**(code **)(*(long *)&G_obj_table_X.pages_[self >> 0xc][self & 0xfff].ptr_ + 0x78))
                    (G_obj_table_X.pages_[self >> 0xc] + (self & 0xfff),
                     CONCAT62(in_register_00000012,prop) & 0xffffffff,&val,self,vVar1,vVar5,&srcobj,
                     &argc_local);
  if (G_predef_X.prop_not_defined_prop != 0 && found == 0) {
    found = (**(code **)(*(long *)&G_obj_table_X.pages_[self >> 0xc][self & 0xfff].ptr_ + 0x78))
                      (G_obj_table_X.pages_[self >> 0xc] + (self & 0xfff),
                       G_predef_X.prop_not_defined_prop,&val,self,vVar1,vVar5,&srcobj,&argc_local);
    pvVar3 = sp_;
    if (found == 0) {
      found = 0;
    }
    else if ((val.typ < VM_FIRST_INVALID_TYPE) &&
            ((0x60800U >> (val.typ & (VM_BIFPTR|VM_ENUM)) & 1) != 0)) {
      pvVar2 = &sp_->typ;
      sp_ = sp_ + 1;
      *pvVar2 = VM_PROP;
      (pvVar3->val).prop = prop;
      argc_local = argc_local + 1;
      prop = G_predef_X.prop_not_defined_prop;
    }
  }
  puVar4 = eval_prop_val(local_58,found,local_5c,&val,self,prop,&orig_target_obj,srcobj,argc_local,
                         (vm_rcdesc *)0x0);
  return puVar4;
}

Assistant:

const uchar *CVmRun::inh_prop(VMG_ uint caller_ofs,
                              vm_prop_id_t prop, uint argc)
{
    vm_val_t orig_target_obj;
    vm_obj_id_t defining_obj;
    vm_val_t val;
    vm_obj_id_t srcobj;
    int found;
    vm_obj_id_t self;

    /* get the defining object from the stack frame */
    defining_obj = get_defining_obj(vmg0_);

    /* get the original target object from the stack frame */
    orig_target_obj.set_obj(get_orig_target_obj(vmg0_));

    /* get the 'self' object */
    self = get_self(vmg0_);

    /* get the inherited property value */
    found = vm_objp(vmg_ self)->inh_prop(vmg_ prop, &val, self,
                                         orig_target_obj.val.obj,
                                         defining_obj, &srcobj, &argc);

    /* if we didn't find it, try inheriting propNotDefined */
    if (!found && G_predef->prop_not_defined_prop != VM_INVALID_PROP)
    {
        /* 
         *   Look up propNotDefined using the same search conditions we used
         *   to find the original inherited property.  This lets us look up
         *   the "inherited" propNotDefined.  
         */
        found = vm_objp(vmg_ self)->inh_prop(vmg_
                                             G_predef->prop_not_defined_prop,
                                             &val, self,
                                             orig_target_obj.val.obj,
                                             defining_obj, &srcobj, &argc);

        /* 
         *   if we found it, and it's code, push the original property ID we
         *   were attempting to inherit - this becomes the new first
         *   parameter to the propNotDefined method 
         */
        if (found
            && (val.typ == VM_CODEOFS
                || val.typ == VM_OBJX
                || val.typ == VM_BIFPTRX))
        {
            /* add the original property pointer argument */
            push_prop(vmg_ prop);

            /* count the additional argument */
            ++argc;

            /* the target property changes to propNotDefined */
            prop = G_predef->prop_not_defined_prop;
        }
    }

    /* 
     *   evaluate and store the result - note that "self" remains the
     *   current "self" object, since we're inheriting within the context
     *   of the original method call 
     */
    return eval_prop_val(vmg_ found, caller_ofs, &val, self, prop,
                         &orig_target_obj, srcobj, argc, 0);
}